

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

ZyanStatus
ZydisStringAppendHexS
          (ZyanString *string,ZyanI64 value,ZyanU8 padding_length,ZyanBool force_leading_number,
          ZyanBool uppercase,ZyanBool force_sign,ZyanStringView *prefix,ZyanStringView *suffix)

{
  ZyanStatus ZVar1;
  ZyanU64 value_00;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZyanBool force_sign_local;
  ZyanBool uppercase_local;
  ZyanBool force_leading_number_local;
  ZyanU8 padding_length_local;
  ZyanI64 value_local;
  ZyanString *string_local;
  
  if (value < 0) {
    string_local._4_4_ = ZydisStringAppendShort(string,&ZydisStringAppendHexS::str_sub);
    if (((string_local._4_4_ & 0x80000000) == 0) &&
       ((prefix == (ZyanStringView *)0x0 ||
        (string_local._4_4_ = ZydisStringAppend(string,prefix),
        (string_local._4_4_ & 0x80000000) == 0)))) {
      value_00 = ZyanAbsI64(value);
      string_local._4_4_ =
           ZydisStringAppendHexU
                     (string,value_00,padding_length,force_leading_number,uppercase,
                      (ZyanStringView *)0x0,suffix);
    }
  }
  else {
    if (force_sign != '\0') {
      if (value < 0) {
        __assert_fail("value >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0x1c7,
                      "ZyanStatus ZydisStringAppendHexS(ZyanString *, ZyanI64, ZyanU8, ZyanBool, ZyanBool, ZyanBool, const ZyanStringView *, const ZyanStringView *)"
                     );
      }
      ZVar1 = ZydisStringAppendShort(string,&ZydisStringAppendHexS::str_add);
      if ((ZVar1 & 0x80000000) != 0) {
        return ZVar1;
      }
    }
    string_local._4_4_ =
         ZydisStringAppendHexU
                   (string,value,padding_length,force_leading_number,uppercase,prefix,suffix);
  }
  return string_local._4_4_;
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisStringAppendHexS(ZyanString* string, ZyanI64 value,
    ZyanU8 padding_length, ZyanBool force_leading_number, ZyanBool uppercase, ZyanBool force_sign,
    const ZyanStringView* prefix, const ZyanStringView* suffix)
{
    static const ZydisShortString str_add = ZYDIS_MAKE_SHORTSTRING("+");
    static const ZydisShortString str_sub = ZYDIS_MAKE_SHORTSTRING("-");

    if (value < 0)
    {
        ZYAN_CHECK(ZydisStringAppendShort(string, &str_sub));
        if (prefix)
        {
            ZYAN_CHECK(ZydisStringAppend(string, prefix));
        }
        return ZydisStringAppendHexU(string, ZyanAbsI64(value), padding_length,
            force_leading_number, uppercase, (const ZyanStringView*)ZYAN_NULL, suffix);
    }

    if (force_sign)
    {
        ZYAN_ASSERT(value >= 0);
        ZYAN_CHECK(ZydisStringAppendShort(string, &str_add));
    }
    return ZydisStringAppendHexU(string, value, padding_length, force_leading_number, uppercase,
        prefix, suffix);
}